

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O1

size_t allocate_tmp_space(estate s,FFSBuffer buf,size_t length,int req_alignment,
                         size_t *tmp_data_loc)

{
  internal_iovec *piVar1;
  size_t *psVar2;
  int iVar3;
  size_t sVar4;
  size_t __n;
  size_t sVar5;
  uint uVar6;
  
  uVar6 = req_alignment - (int)s->output_len & req_alignment - 1U;
  ensure_writev_room(s,(int)buf);
  __n = (size_t)(int)uVar6;
  sVar4 = add_to_tmp_buffer(buf,length + __n);
  if (sVar4 == 0xffffffffffffffff) {
    sVar5 = 0xffffffffffffffff;
  }
  else {
    if (uVar6 != 0) {
      iVar3 = s->iovcnt;
      if (s->iovec[(long)iVar3 + -1].iov_base == (void *)0x0) {
        memset((void *)((long)buf->tmp_buffer + sVar4),0,__n);
        sVar4 = sVar4 + __n;
        psVar2 = &s->iovec[(long)s->iovcnt + -1].iov_len;
        *psVar2 = *psVar2 + __n;
      }
      else {
        piVar1 = s->iovec + iVar3;
        piVar1->iov_len = __n;
        piVar1->iov_offset = 0;
        piVar1->iov_base = zeroes;
        s->iovcnt = iVar3 + 1;
      }
    }
    sVar5 = __n + s->output_len;
    if (tmp_data_loc != (size_t *)0x0) {
      *tmp_data_loc = sVar4;
    }
    s->output_len = s->output_len + length + __n;
  }
  return sVar5;
}

Assistant:

size_t
allocate_tmp_space(estate s, FFSBuffer buf, size_t length, int req_alignment, size_t *tmp_data_loc)
{
    int pad = (req_alignment - s->output_len) & (req_alignment -1);  /*  only works if req_align is power of two */
    size_t tmp_data, msg_offset;
    switch (req_alignment) {
    case 1: case 2: case 4: case 8: case 16: break;
    default:
	assert(0);
    }
    ensure_writev_room(s, 2);
    tmp_data = add_to_tmp_buffer(buf, length + pad);
    if (tmp_data == (size_t)-1) return (size_t) -1;
    if (pad != 0) {
	if (s->iovec[s->iovcnt-1].iov_base == NULL) {
	    /* last was tmp too */
	    memset((char*)buf->tmp_buffer + tmp_data, 0, pad);	/* zero pad */
	    tmp_data += pad;
	    s->iovec[s->iovcnt-1].iov_len += pad;
	} else {
	    s->iovec[s->iovcnt].iov_len = pad;
	    s->iovec[s->iovcnt].iov_offset = 0;
	    s->iovec[s->iovcnt].iov_base = zeroes;
	    s->iovcnt++;
	}
    }
    msg_offset = s->output_len + pad;
    if (tmp_data_loc) *tmp_data_loc = tmp_data;
    s->output_len += length + pad;
    return msg_offset;
}